

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

UGroup * __thiscall re2::LookupGroup(re2 *this,StringPiece *name,UGroup *groups,int ngroups)

{
  re2 *__s;
  int iVar1;
  StringPiece *pSVar2;
  long lVar3;
  UGroup *pUVar4;
  ulong uVar5;
  
  if (ngroups < 1) {
    return (UGroup *)0x0;
  }
  uVar5 = (ulong)(uint)ngroups;
  lVar3 = 0;
  pUVar4 = groups;
  do {
    __s = (re2 *)pUVar4->name;
    if (__s == (re2 *)0x0) {
      pSVar2 = (StringPiece *)0x0;
    }
    else {
      pSVar2 = (StringPiece *)strlen((char *)__s);
    }
    if (pSVar2 == name) {
      if (__s == this) {
        return groups + lVar3;
      }
      if (name == (StringPiece *)0x0) {
        return groups + lVar3;
      }
      iVar1 = bcmp(__s,this,(size_t)name);
      if (iVar1 == 0) {
        return pUVar4;
      }
    }
    lVar3 = lVar3 + 1;
    pUVar4 = pUVar4 + 1;
    uVar5 = uVar5 - 1;
    if (uVar5 == 0) {
      return (UGroup *)0x0;
    }
  } while( true );
}

Assistant:

static const UGroup* LookupGroup(const StringPiece& name,
                                 const UGroup *groups, int ngroups) {
  // Simple name lookup.
  for (int i = 0; i < ngroups; i++)
    if (StringPiece(groups[i].name) == name)
      return &groups[i];
  return NULL;
}